

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double get_second_ref_usage_thresh(int frame_count_so_far)

{
  double second_ref_usage_thresh_max_delta;
  double min_second_ref_usage_thresh;
  int adapt_upto;
  int frame_count_so_far_local;
  undefined8 local_8;
  
  if (frame_count_so_far < 0x20) {
    local_8 = ((double)frame_count_so_far / 31.0) * 0.035 + 0.085;
  }
  else {
    local_8 = 0.12000000000000001;
  }
  return local_8;
}

Assistant:

static double get_second_ref_usage_thresh(int frame_count_so_far) {
  const int adapt_upto = 32;
  const double min_second_ref_usage_thresh = 0.085;
  const double second_ref_usage_thresh_max_delta = 0.035;
  if (frame_count_so_far >= adapt_upto) {
    return min_second_ref_usage_thresh + second_ref_usage_thresh_max_delta;
  }
  return min_second_ref_usage_thresh +
         ((double)frame_count_so_far / (adapt_upto - 1)) *
             second_ref_usage_thresh_max_delta;
}